

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Promise<void> __thiscall capnp::ClientHook::whenResolved(ClientHook *this)

{
  PromiseNode *pPVar1;
  kj kVar2;
  Disposer *pDVar3;
  TransformPromiseNodeBase *this_00;
  ImmediatePromiseNode<kj::_::Void> *pIVar4;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  long *in_RSI;
  Own<kj::_::ChainPromiseNode> OVar5;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Promise<void> PVar7;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> promise;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined8 uStack_20;
  PromiseNode *pPStack_18;
  
  (**(code **)(*in_RSI + 0x18))(&local_28);
  kVar2 = local_28._0_1_;
  if (local_28._0_1_ == (kj)0x1) {
    local_48.disposer = uStack_20;
    local_48.ptr = pPStack_18;
    pPStack_18 = (PromiseNode *)0x0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_48,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:93:26),_kj::_::PropagateException>
               ::anon_class_1_0_00000001_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00381168;
    local_38.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<capnp::ClientHook>,capnp::ClientHook::whenResolved()::$_0,kj::_::PropagateException>>
          ::instance;
    local_38.ptr = (PromiseNode *)this_00;
    OVar5 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_28,&local_38)
    ;
    pPVar1 = local_38.ptr;
    pIVar4 = (ImmediatePromiseNode<kj::_::Void> *)OVar5.ptr;
    *(undefined4 *)&this->_vptr_ClientHook = local_28;
    *(undefined4 *)((long)&this->_vptr_ClientHook + 4) = uStack_24;
    *(undefined4 *)&this[1]._vptr_ClientHook = (undefined4)uStack_20;
    *(undefined4 *)((long)&this[1]._vptr_ClientHook + 4) = uStack_20._4_4_;
    if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
      local_38.ptr = (PromiseNode *)0x0;
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar4 = extraout_RDX;
    }
  }
  else {
    OVar6 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_28);
    pDVar3 = uStack_20;
    pIVar4 = OVar6.ptr;
    uStack_20 = (Disposer *)0x0;
    this->_vptr_ClientHook = (_func_int **)CONCAT44(uStack_24,local_28);
    this[1]._vptr_ClientHook = (_func_int **)pDVar3;
  }
  pPVar1 = local_48.ptr;
  if ((kVar2 == (kj)0x1) && (local_48.ptr != (PromiseNode *)0x0)) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pIVar4 = extraout_RDX_00;
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pIVar4;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> ClientHook::whenResolved() {
  KJ_IF_MAYBE(promise, whenMoreResolved()) {
    return promise->then([](kj::Own<ClientHook>&& resolution) {
      return resolution->whenResolved();
    });
  } else {
    return kj::READY_NOW;
  }